

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O1

string * __thiscall
bgui::ImageAdapter<float>::getDescriptionOfPixel_abi_cxx11_
          (string *__return_storage_ptr__,ImageAdapter<float> *this,long x,long y)

{
  double dVar1;
  ImageAdapterBase *pIVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  SVector<long,_2> p;
  ostringstream os;
  long local_1d8 [6];
  long local_1a8 [2];
  undefined8 auStack_198 [12];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  dVar1 = (this->super_ImageAdapterBase).scale;
  pIVar2 = &this->super_ImageAdapterBase;
  local_1d8[3] = (long)((double)x / dVar1);
  local_1d8[4] = (long)((double)y / dVar1);
  local_1d8[5] = 1;
  local_1d8[0] = 0;
  local_1d8[1] = 0;
  lVar4 = 0;
  do {
    lVar5 = local_1d8[lVar4];
    lVar6 = 0;
    do {
      lVar5 = lVar5 + local_1d8[lVar6 + 3] * (pIVar2->R).v[0][lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    local_1d8[lVar4] = lVar5;
    pIVar2 = (ImageAdapterBase *)(pIVar2->R).v;
    bVar7 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"x=",2);
  lVar4 = local_1d8[0];
  *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = 5;
  poVar3 = std::ostream::_M_insert<long>((long)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", y=",4);
  lVar5 = local_1d8[1];
  *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = 5;
  poVar3 = std::ostream::_M_insert<long>((long)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  if (0 < this->image->depth) {
    lVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = 5;
      std::ostream::_M_insert<double>((double)this->image->img[lVar6][lVar5][lVar4]);
      lVar6 = lVar6 + 1;
    } while (lVar6 < this->image->depth);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string getDescriptionOfPixel(long x, long y) const
    {
      std::ostringstream os;

      x=static_cast<long>(x/scale);
      y=static_cast<long>(y/scale);

      gmath::SVector<long, 2> p=R*gmath::SVector<long, 3>(x, y, 1);

      os << "x=";

      os.width(5);
      os << p[0] << ", y=";

      os.width(5);
      os << p[1] << ":";

      for (int d=0; d<image->getDepth(); d++)
      {
        os << " ";

        os.width(5);
        os << image->getW(p[0], p[1], d);
      }

      return os.str();
    }